

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O2

_Bool load_settings(char *section,Conf *conf)

{
  settings_r *sesskey;
  
  sesskey = open_settings_r(section);
  load_open_settings(sesskey,conf);
  close_settings_r(sesskey);
  if (sesskey != (settings_r *)0x0) {
    conf_launchable(conf);
  }
  return sesskey != (settings_r *)0x0;
}

Assistant:

bool load_settings(const char *section, Conf *conf)
{
    settings_r *sesskey;

    sesskey = open_settings_r(section);
    bool exists = (sesskey != NULL);
    load_open_settings(sesskey, conf);
    close_settings_r(sesskey);

    if (exists && conf_launchable(conf))
        add_session_to_jumplist(section);

    return exists;
}